

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::tightenCoefficients
          (HighsDomain *this,HighsInt *inds,double *vals,HighsInt len,double *rhs)

{
  bool bVar1;
  HighsVarType HVar2;
  const_reference pvVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  HighsMipSolver *in_RDI;
  double *in_R8;
  double dVar4;
  HighsCDouble delta_1;
  HighsCDouble delta;
  HighsInt i_1;
  HighsInt tightened;
  HighsCDouble upper;
  HighsCDouble maxabscoef;
  HighsInt i;
  HighsCDouble maxactivity;
  HighsCDouble *in_stack_ffffffffffffff38;
  HighsCDouble in_stack_ffffffffffffff48;
  int local_68;
  int local_64;
  HighsCDouble local_60;
  HighsCDouble local_50;
  int local_3c;
  HighsCDouble local_38;
  double *local_28;
  int local_1c;
  long local_18;
  long local_10;
  
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  HighsCDouble::HighsCDouble(&local_38,0.0);
  local_3c = 0;
  do {
    if (local_3c == local_1c) {
      local_50 = HighsCDouble::operator-((HighsCDouble *)in_RDI,(double)in_stack_ffffffffffffff38);
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x5cbd4b);
      bVar1 = HighsCDouble::operator>((HighsCDouble *)in_RDI,(double)in_stack_ffffffffffffff38);
      if (bVar1) {
        HighsCDouble::HighsCDouble(&local_60,*local_28);
        local_64 = 0;
        for (local_68 = 0; local_68 != local_1c; local_68 = local_68 + 1) {
          HVar2 = HighsMipSolver::variableType
                            (in_RDI,(HighsInt)((ulong)in_stack_ffffffffffffff38 >> 0x20));
          if (HVar2 != kContinuous) {
            bVar1 = operator>((double)in_RDI,in_stack_ffffffffffffff38);
            if (bVar1) {
              ::operator-(in_stack_ffffffffffffff48.lo,(HighsCDouble *)in_stack_ffffffffffffff48.hi)
              ;
              std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)
                         &in_RDI[1].analysis_.analyse_mip_time,
                         (long)*(int *)(local_10 + (long)local_68 * 4));
              HighsCDouble::operator*
                        ((HighsCDouble *)in_stack_ffffffffffffff48.lo,in_stack_ffffffffffffff48.hi);
              HighsCDouble::operator-=((HighsCDouble *)in_RDI,in_stack_ffffffffffffff38);
              dVar4 = HighsCDouble::operator_cast_to_double(&local_50);
              *(double *)(local_18 + (long)local_68 * 8) = dVar4;
              local_64 = local_64 + 1;
            }
            else {
              in_stack_ffffffffffffff38 = *(HighsCDouble **)(local_18 + (long)local_68 * 8);
              HighsCDouble::operator-((HighsCDouble *)0x5cbeac);
              bVar1 = ::operator<((double)in_RDI,in_stack_ffffffffffffff38);
              if (bVar1) {
                ::operator-(in_stack_ffffffffffffff48.lo,
                            (HighsCDouble *)in_stack_ffffffffffffff48.hi);
                std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           &in_RDI[1].analysis_.mip_clocks.clock_,
                           (long)*(int *)(local_10 + (long)local_68 * 4));
                in_stack_ffffffffffffff48 =
                     HighsCDouble::operator*
                               ((HighsCDouble *)in_stack_ffffffffffffff48.lo,
                                in_stack_ffffffffffffff48.hi);
                HighsCDouble::operator+=((HighsCDouble *)in_RDI,in_stack_ffffffffffffff38);
                dVar4 = HighsCDouble::operator_cast_to_double(&local_50);
                *(double *)(local_18 + (long)local_68 * 8) = -dVar4;
                local_64 = local_64 + 1;
              }
            }
          }
        }
        if (local_64 != 0) {
          dVar4 = HighsCDouble::operator_cast_to_double(&local_60);
          *local_28 = dVar4;
        }
      }
      return;
    }
    if (*(double *)(local_18 + (long)local_3c * 8) <= 0.0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[1].analysis_.mip_clocks.clock_,
                          (long)*(int *)(local_10 + (long)local_3c * 4));
      if ((*pvVar3 == -INFINITY) && (!NAN(*pvVar3))) {
        return;
      }
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)&in_RDI[1].analysis_.mip_clocks.clock_,
                 (long)*(int *)(local_10 + (long)local_3c * 4));
      HighsCDouble::operator+=
                ((HighsCDouble *)in_stack_ffffffffffffff48.lo,in_stack_ffffffffffffff48.hi);
    }
    else {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[1].analysis_.analyse_mip_time,
                          (long)*(int *)(local_10 + (long)local_3c * 4));
      if ((*pvVar3 == INFINITY) && (!NAN(*pvVar3))) {
        return;
      }
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)&in_RDI[1].analysis_.analyse_mip_time,
                 (long)*(int *)(local_10 + (long)local_3c * 4));
      HighsCDouble::operator+=
                ((HighsCDouble *)in_stack_ffffffffffffff48.lo,in_stack_ffffffffffffff48.hi);
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

void HighsDomain::tightenCoefficients(HighsInt* inds, double* vals,
                                      HighsInt len, double& rhs) const {
  HighsCDouble maxactivity = 0;

  for (HighsInt i = 0; i != len; ++i) {
    if (vals[i] > 0) {
      if (col_upper_[inds[i]] == kHighsInf) return;

      maxactivity += col_upper_[inds[i]] * vals[i];
    } else {
      if (col_lower_[inds[i]] == -kHighsInf) return;

      maxactivity += col_lower_[inds[i]] * vals[i];
    }
  }

  HighsCDouble maxabscoef = maxactivity - rhs;
  if (maxabscoef > mipsolver->mipdata_->feastol) {
    HighsCDouble upper = rhs;
    HighsInt tightened = 0;
    for (HighsInt i = 0; i != len; ++i) {
      if (mipsolver->variableType(inds[i]) == HighsVarType::kContinuous)
        continue;
      if (vals[i] > maxabscoef) {
        HighsCDouble delta = vals[i] - maxabscoef;
        upper -= delta * col_upper_[inds[i]];
        vals[i] = double(maxabscoef);
        ++tightened;
      } else if (vals[i] < -maxabscoef) {
        HighsCDouble delta = -vals[i] - maxabscoef;
        upper += delta * col_lower_[inds[i]];
        vals[i] = -double(maxabscoef);
        ++tightened;
      }
    }

    if (tightened != 0) {
      // printf("tightened %" HIGHSINT_FORMAT " coefficients, rhs changed from
      // %g to %g\n",
      //       tightened, rhs, double(upper));
      rhs = double(upper);
    }
  }
}